

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::ClosePopupToLevel(int remaining,bool restore_focus_to_window_under_popup)

{
  int *piVar1;
  ImGuiPopupData *pIVar2;
  ImGuiWindow *pIVar3;
  ImGuiContext *pIVar4;
  ImGuiPopupData *__dest;
  int iVar5;
  ImGuiWindow *pIVar6;
  ImGuiContext *ctx;
  
  pIVar4 = GImGui;
  pIVar2 = (GImGui->OpenPopupStack).Data;
  pIVar6 = pIVar2[remaining].Window;
  pIVar3 = pIVar2[remaining].SourceWindow;
  iVar5 = (GImGui->OpenPopupStack).Capacity;
  if (iVar5 < remaining) {
    if (iVar5 == 0) {
      iVar5 = 8;
    }
    else {
      iVar5 = iVar5 / 2 + iVar5;
    }
    if (iVar5 <= remaining) {
      iVar5 = remaining;
    }
    piVar1 = &(GImGui->IO).MetricsActiveAllocations;
    *piVar1 = *piVar1 + 1;
    __dest = (ImGuiPopupData *)(*GImAllocatorAllocFunc)((long)iVar5 * 0x30,GImAllocatorUserData);
    pIVar2 = (pIVar4->OpenPopupStack).Data;
    if (pIVar2 != (ImGuiPopupData *)0x0) {
      memcpy(__dest,pIVar2,(long)(pIVar4->OpenPopupStack).Size * 0x30);
      pIVar2 = (pIVar4->OpenPopupStack).Data;
      if ((pIVar2 != (ImGuiPopupData *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + -1;
      }
      (*GImAllocatorFreeFunc)(pIVar2,GImAllocatorUserData);
    }
    (pIVar4->OpenPopupStack).Data = __dest;
    (pIVar4->OpenPopupStack).Capacity = iVar5;
  }
  (pIVar4->OpenPopupStack).Size = remaining;
  if (!restore_focus_to_window_under_popup) {
    return;
  }
  if (pIVar3 == (ImGuiWindow *)0x0) {
    pIVar6 = (ImGuiWindow *)0x0;
  }
  else {
    if (pIVar6 != (ImGuiWindow *)0x0 && pIVar3->WasActive == false) {
      FocusTopMostWindowUnderOne(pIVar6,(ImGuiWindow *)0x0);
      return;
    }
    if (((pIVar4->NavLayer != ImGuiNavLayer_Main) ||
        (pIVar6 = pIVar3->NavLastChildNavWindow, pIVar6 == (ImGuiWindow *)0x0)) ||
       (pIVar6->WasActive == false)) {
      pIVar6 = pIVar3;
    }
  }
  FocusWindow(pIVar6);
  return;
}

Assistant:

void ImGui::ClosePopupToLevel(int remaining, bool restore_focus_to_window_under_popup)
{
    ImGuiContext& g = *GImGui;
    IMGUI_DEBUG_LOG_POPUP("ClosePopupToLevel(%d), restore_focus_to_window_under_popup=%d\n", remaining, restore_focus_to_window_under_popup);
    IM_ASSERT(remaining >= 0 && remaining < g.OpenPopupStack.Size);

    // Trim open popup stack
    ImGuiWindow* focus_window = g.OpenPopupStack[remaining].SourceWindow;
    ImGuiWindow* popup_window = g.OpenPopupStack[remaining].Window;
    g.OpenPopupStack.resize(remaining);

    if (restore_focus_to_window_under_popup)
    {
        if (focus_window && !focus_window->WasActive && popup_window)
        {
            // Fallback
            FocusTopMostWindowUnderOne(popup_window, NULL);
        }
        else
        {
            if (g.NavLayer == ImGuiNavLayer_Main && focus_window)
                focus_window = NavRestoreLastChildNavWindow(focus_window);
            FocusWindow(focus_window);
        }
    }
}